

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

Limit __thiscall
google::protobuf::io::CodedInputStream::ReadLengthAndPushLimit(CodedInputStream *this)

{
  bool bVar1;
  Limit LVar2;
  uint32 in_register_00000004;
  uint32 byte_limit;
  uint32 local_14 [2];
  uint32 length;
  
  local_14[0] = in_register_00000004;
  bVar1 = ReadVarint32(this,local_14);
  byte_limit = 0;
  if (bVar1) {
    byte_limit = local_14[0];
  }
  LVar2 = PushLimit(this,byte_limit);
  return LVar2;
}

Assistant:

CodedInputStream::Limit CodedInputStream::ReadLengthAndPushLimit() {
  uint32 length;
  return PushLimit(ReadVarint32(&length) ? length : 0);
}